

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-util.cpp
# Opt level: O0

int importKeyPair(char *filePath,char *filePIN,CK_SLOT_ID slotID,char *userPIN,char *label,
                 char *objectID,int forceExec,int noPublicKey)

{
  int iVar1;
  char *objID_00;
  CK_RV CVar2;
  size_t sVar3;
  char *filePIN_00;
  char *label_00;
  CK_SLOT_ID in_RDX;
  long in_R8;
  char *in_R9;
  int in_stack_00000008;
  int result;
  CK_OBJECT_HANDLE oHandle;
  CK_RV rv;
  CK_SESSION_HANDLE hSession;
  char *objID;
  size_t objIDLen;
  char user_pin_copy [256];
  size_t *in_stack_fffffffffffffe88;
  CK_C_Login p_Var4;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  char *in_stack_fffffffffffffeb0;
  char *filePath_00;
  CK_OBJECT_CLASS oClass;
  CK_SESSION_HANDLE in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed0;
  int local_4;
  
  if (in_R8 == 0) {
    fprintf(_stderr,"ERROR: A label for the object must be supplied. Use --label <text>\n");
    local_4 = 1;
  }
  else if (in_R9 == (char *)0x0) {
    fprintf(_stderr,"ERROR: An ID for the object must be supplied. Use --id <hex>\n");
    local_4 = 1;
  }
  else {
    oClass = 0;
    strlen(in_R9);
    objID_00 = hexStrToBin((char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                           (int)((ulong)in_R9 >> 0x20),in_stack_fffffffffffffe88);
    if (objID_00 == (char *)0x0) {
      fprintf(_stderr,"Please edit --id <hex> to correct error.\n");
      local_4 = 1;
    }
    else {
      CVar2 = (*p11->C_OpenSession)
                        (in_RDX,6,(void *)0x0,(CK_NOTIFY)0x0,
                         (CK_SESSION_HANDLE *)&stack0xfffffffffffffeb0);
      if (CVar2 == 0) {
        iVar1 = getPW((char *)user_pin_copy._40_8_,(char *)user_pin_copy._32_8_,user_pin_copy._24_8_
                     );
        if (iVar1 == 0) {
          p_Var4 = p11->C_Login;
          filePath_00 = in_stack_fffffffffffffeb0;
          sVar3 = strlen(&stack0xfffffffffffffec8);
          filePIN_00 = (char *)(*p_Var4)((CK_SESSION_HANDLE)in_stack_fffffffffffffeb0,1,
                                         &stack0xfffffffffffffec8,sVar3);
          if (filePIN_00 == (char *)0x0) {
            label_00 = (char *)searchObject(in_stack_fffffffffffffec8,oClass,objID_00,
                                            (size_t)filePath_00);
            if ((label_00 == (char *)0x0) || (in_stack_00000008 != 0)) {
              crypto_init();
              local_4 = crypto_import_key_pair
                                  ((CK_SESSION_HANDLE)objID_00,filePath_00,filePIN_00,label_00,
                                   (char *)CONCAT44(in_stack_fffffffffffffe9c,
                                                    in_stack_fffffffffffffe98),(size_t)in_R9,
                                   in_stack_fffffffffffffed0);
              crypto_final();
              free(objID_00);
            }
            else {
              free(objID_00);
              fprintf(_stderr,
                      "ERROR: The ID is already assigned to another object. Use --force to override this message.\n"
                     );
              local_4 = 1;
            }
          }
          else {
            if (filePIN_00 == (char *)0xa0) {
              fprintf(_stderr,"ERROR: The given user PIN does not match the one in the token.\n");
            }
            else {
              fprintf(_stderr,"ERROR: Could not log in on the token.\n");
            }
            free(objID_00);
            local_4 = 1;
          }
        }
        else {
          fprintf(_stderr,"ERROR: Could not get user PIN\n");
          free(objID_00);
          local_4 = 1;
        }
      }
      else {
        if (CVar2 == 3) {
          fprintf(_stderr,"ERROR: The given slot does not exist.\n");
        }
        else {
          fprintf(_stderr,"ERROR: Could not open a session on the given slot.\n");
        }
        free(objID_00);
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

int importKeyPair
(
	char* filePath,
	char* filePIN,
	CK_SLOT_ID slotID,
	char* userPIN,
	char* label,
	char* objectID,
	int forceExec,
	int noPublicKey
)
{
	char user_pin_copy[MAX_PIN_LEN+1];

	if (label == NULL)
	{
		fprintf(stderr, "ERROR: A label for the object must be supplied. "
				"Use --label <text>\n");
		return 1;
	}

	if (objectID == NULL)
	{
		fprintf(stderr, "ERROR: An ID for the object must be supplied. "
				"Use --id <hex>\n");
		return 1;
	}

	size_t objIDLen = 0;
	char* objID = hexStrToBin(objectID, strlen(objectID), &objIDLen);
	if (objID == NULL)
	{
		fprintf(stderr, "Please edit --id <hex> to correct error.\n");
		return 1;
	}

	CK_SESSION_HANDLE hSession;
	CK_RV rv = p11->C_OpenSession(slotID, CKF_SERIAL_SESSION | CKF_RW_SESSION,
					NULL_PTR, NULL_PTR, &hSession);
	if (rv != CKR_OK)
	{
		if (rv == CKR_SLOT_ID_INVALID)
		{
			fprintf(stderr, "ERROR: The given slot does not exist.\n");
		}
		else
		{
			fprintf(stderr, "ERROR: Could not open a session on the given slot.\n");
		}
		free(objID);
		return 1;
	}

	// Get the password
	if (getPW(userPIN, user_pin_copy, CKU_USER) != 0)
	{
		fprintf(stderr, "ERROR: Could not get user PIN\n");
		free(objID);
		return 1;
	}

	rv = p11->C_Login(hSession, CKU_USER, (CK_UTF8CHAR_PTR)user_pin_copy, strlen(user_pin_copy));
	if (rv != CKR_OK)
	{
		if (rv == CKR_PIN_INCORRECT) {
			fprintf(stderr, "ERROR: The given user PIN does not match the one in the token.\n");
		}
		else
		{
			fprintf(stderr, "ERROR: Could not log in on the token.\n");
		}
		free(objID);
		return 1;
	}

	CK_OBJECT_HANDLE oHandle = searchObject(hSession, CKO_PRIVATE_KEY, objID, objIDLen);
	if (oHandle != CK_INVALID_HANDLE && forceExec == 0)
	{
		free(objID);
		fprintf(stderr, "ERROR: The ID is already assigned to another object. "
				"Use --force to override this message.\n");
		return 1;
	}

	crypto_init();
	int result = crypto_import_key_pair(hSession, filePath, filePIN, label, objID, objIDLen, noPublicKey);
	crypto_final();

	free(objID);

	return result;
}